

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTestCurl.cxx
# Opt level: O0

void __thiscall cmCTestCurlOpts::cmCTestCurlOpts(cmCTestCurlOpts *this,cmCTest *ctest)

{
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  init;
  cmCTest *pcVar1;
  bool bVar2;
  ulong uVar3;
  string_view val;
  string *local_1d0;
  bool local_17b;
  _Optional_payload_base<bool> local_17a;
  reference local_178;
  string *arg;
  iterator __end2;
  iterator __begin2;
  cmList *__range2;
  string local_150;
  string *local_130;
  string local_128;
  iterator local_108;
  size_type local_100;
  undefined1 local_f8 [8];
  cmList args;
  bool local_cc;
  _Optional_payload_base<bool> local_cb;
  allocator<char> local_c9;
  string local_c8;
  undefined1 local_a8 [8];
  string tlsVerify;
  allocator<char> local_71;
  string local_70;
  string local_50;
  string_view local_30;
  _Optional_payload_base<int> local_20;
  cmCTest *local_18;
  cmCTest *ctest_local;
  cmCTestCurlOpts *this_local;
  
  local_18 = ctest;
  ctest_local = (cmCTest *)this;
  std::optional<int>::optional(&this->TLSVersionOpt);
  std::optional<bool>::optional(&this->TLSVerifyOpt);
  pcVar1 = local_18;
  this->VerifyHostOff = false;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_70,"TLSVersion",&local_71);
  cmCTest::GetCTestConfiguration(&local_50,pcVar1,&local_70);
  local_30 = (string_view)
             std::__cxx11::string::operator_cast_to_basic_string_view((string *)&local_50);
  local_20 = (_Optional_payload_base<int>)cmCurlParseTLSVersion(local_30);
  (this->TLSVersionOpt).super__Optional_base<int,_true,_true>._M_payload.
  super__Optional_payload_base<int> = local_20;
  std::__cxx11::string::~string((string *)&local_50);
  std::__cxx11::string::~string((string *)&local_70);
  std::allocator<char>::~allocator(&local_71);
  pcVar1 = local_18;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_c8,"TLSVerify",&local_c9);
  cmCTest::GetCTestConfiguration((string *)local_a8,pcVar1,&local_c8);
  std::__cxx11::string::~string((string *)&local_c8);
  std::allocator<char>::~allocator(&local_c9);
  uVar3 = std::__cxx11::string::empty();
  pcVar1 = local_18;
  if ((uVar3 & 1) == 0) {
    val = (string_view)std::__cxx11::string::operator_cast_to_basic_string_view((string *)local_a8);
    args.Values.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)val._M_len;
    local_cc = cmIsOn(val);
    std::optional<bool>::optional<bool,_true>((optional<bool> *)&local_cb,&local_cc);
    (this->TLSVerifyOpt).super__Optional_base<bool,_true,_true>._M_payload.
    super__Optional_payload_base<bool> = local_cb;
  }
  else {
    __range2._6_1_ = 1;
    local_130 = &local_128;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_150,"CurlOptions",(allocator<char> *)((long)&__range2 + 7));
    cmCTest::GetCTestConfiguration(&local_128,pcVar1,&local_150);
    __range2._6_1_ = 0;
    local_108 = &local_128;
    local_100 = 1;
    init._M_len = 1;
    init._M_array = local_108;
    cmList::cmList((cmList *)local_f8,init);
    local_1d0 = (string *)&local_108;
    do {
      local_1d0 = local_1d0 + -1;
      std::__cxx11::string::~string((string *)local_1d0);
    } while (local_1d0 != &local_128);
    std::__cxx11::string::~string((string *)&local_150);
    std::allocator<char>::~allocator((allocator<char> *)((long)&__range2 + 7));
    __end2 = cmList::begin_abi_cxx11_((cmList *)local_f8);
    arg = (string *)cmList::end_abi_cxx11_((cmList *)local_f8);
    while( true ) {
      bVar2 = __gnu_cxx::operator!=
                        (&__end2,(__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                  *)&arg);
      if (!bVar2) break;
      local_178 = __gnu_cxx::
                  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                  ::operator*(&__end2);
      bVar2 = std::operator==(local_178,"CURLOPT_SSL_VERIFYPEER_OFF");
      if (bVar2) {
        local_17b = false;
        std::optional<bool>::optional<bool,_true>((optional<bool> *)&local_17a,&local_17b);
        (this->TLSVerifyOpt).super__Optional_base<bool,_true,_true>._M_payload.
        super__Optional_payload_base<bool> = local_17a;
      }
      bVar2 = std::operator==(local_178,"CURLOPT_SSL_VERIFYHOST_OFF");
      if (bVar2) {
        this->VerifyHostOff = true;
      }
      __gnu_cxx::
      __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::operator++(&__end2);
    }
    cmList::~cmList((cmList *)local_f8);
  }
  std::__cxx11::string::~string((string *)local_a8);
  return;
}

Assistant:

cmCTestCurlOpts::cmCTestCurlOpts(cmCTest* ctest)
{
  this->TLSVersionOpt =
    cmCurlParseTLSVersion(ctest->GetCTestConfiguration("TLSVersion"));

  std::string tlsVerify = ctest->GetCTestConfiguration("TLSVerify");
  if (!tlsVerify.empty()) {
    this->TLSVerifyOpt = cmIsOn(tlsVerify);
  } else {
    cmList args{ ctest->GetCTestConfiguration("CurlOptions") };
    for (std::string const& arg : args) {
      if (arg == "CURLOPT_SSL_VERIFYPEER_OFF") {
        this->TLSVerifyOpt = false;
      }
      if (arg == "CURLOPT_SSL_VERIFYHOST_OFF") {
        this->VerifyHostOff = true;
      }
    }
  }
}